

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O1

DeriveRec * __thiscall amrex::DeriveList::get(DeriveList *this,string *name)

{
  pointer __s2;
  _List_node_base *p_Var1;
  _List_node_base *__n;
  list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *plVar2;
  int iVar3;
  _List_node_base *p_Var4;
  
  p_Var4 = (this->lst).super__List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)this) {
    __s2 = (name->_M_dataplus)._M_p;
    p_Var1 = (_List_node_base *)name->_M_string_length;
    do {
      __n = *(_List_node_base **)((long)(p_Var4 + 1) + 8);
      if (__n == p_Var1) {
        plVar2 = (list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)(p_Var4 + 1);
        if (__n == (_List_node_base *)0x0) {
          return (DeriveRec *)plVar2;
        }
        iVar3 = bcmp(*(void **)&plVar2->
                                super__List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>
                     ,__s2,(size_t)__n);
        if (iVar3 == 0) {
          return (DeriveRec *)plVar2;
        }
      }
      p_Var4 = (((list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)&p_Var4->_M_next)->
               super__List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>)._M_impl.
               _M_node.super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)this);
  }
  return (DeriveRec *)0x0;
}

Assistant:

const DeriveRec*
DeriveList::get (const std::string& name) const
{
    for (std::list<DeriveRec>::const_iterator li = lst.begin(), End = lst.end();
         li != End;
         ++li)
    {
        if (li->derive_name == name)
            return &(*li);
    }
    return 0;
}